

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_func.h
# Opt level: O1

DLDataType __thiscall tvm::runtime::TVMArgValue::operator_cast_to_DLDataType(TVMArgValue *this)

{
  int *x;
  int iVar1;
  DLDataType DVar2;
  ostream *poVar3;
  size_t sVar4;
  uint uVar5;
  uint uVar6;
  char *__s;
  LogCheckError _check_err;
  LogCheckError local_358;
  string local_350;
  LogMessageFatal local_330;
  LogMessageFatal local_1a8;
  
  iVar1 = (this->super_TVMPODValue_).type_code_;
  if (iVar1 == 4) {
    DVar2.code = '\x03';
    DVar2.bits = '\0';
    DVar2.lanes = 0;
    uVar6 = 0;
    uVar5 = 0;
  }
  else if (iVar1 == 0xb) {
    operator_cast_to_string(&local_350,this);
    DVar2 = String2DLDataType(&local_350);
    uVar6 = (uint)DVar2 >> 8;
    uVar5 = (uint)DVar2 >> 0x10;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      operator_delete(local_350._M_dataplus._M_p);
    }
  }
  else {
    x = &(this->super_TVMPODValue_).type_code_;
    local_1a8.log_stream_ = (ostringstream)0x5;
    local_1a8._1_3_ = 0;
    dmlc::LogCheck_EQ<int,TVMTypeCode>((dmlc *)&local_358,x,(anon_enum_32 *)&local_1a8);
    if (local_358.str != (string *)0x0) {
      dmlc::LogMessageFatal::LogMessageFatal
                (&local_330,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/liueo[P]TVM-deploy/tvm/include/tvm/runtime/packed_func.h"
                 ,0x237);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_330,"Check failed: ",0xe)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_330,"type_code_ == kTVMDataType",0x1a);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_330,((local_358.str)->_M_dataplus)._M_p,
                          (local_358.str)->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," expected ",10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"DLDataType",10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," but get ",9);
      uVar5 = *x;
      if ((ulong)uVar5 < 0xe) {
        __s = *(char **)(&DAT_0023e5f8 + (ulong)uVar5 * 8);
      }
      else {
        dmlc::LogMessageFatal::LogMessageFatal
                  (&local_1a8,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/liueo[P]TVM-deploy/tvm/include/tvm/runtime/packed_func.h"
                   ,0x3f6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"unknown type_code=",0x12);
        std::ostream::operator<<((ostream *)&local_1a8,uVar5);
        dmlc::LogMessageFatal::~LogMessageFatal(&local_1a8);
        __s = "";
      }
      sVar4 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,__s,sVar4);
      dmlc::LogMessageFatal::~LogMessageFatal(&local_330);
    }
    dmlc::LogCheckError::~LogCheckError(&local_358);
    DVar2.bits = '\0';
    DVar2.lanes = 0;
    DVar2.code = (this->super_TVMPODValue_).value_.v_type.code;
    uVar6 = (uint)(this->super_TVMPODValue_).value_.v_type.bits;
    uVar5 = (uint)(this->super_TVMPODValue_).value_.v_type.lanes;
  }
  return (DLDataType)((uint)DVar2 & 0xff | (uVar6 & 0xff) << 8 | uVar5 << 0x10);
}

Assistant:

operator DLDataType() const {
    if (type_code_ == kTVMStr) {
      return String2DLDataType(operator std::string());
    }
    // None type
    if (type_code_ == kTVMNullptr) {
      DLDataType t;
      t.code = kTVMOpaqueHandle; t.bits = 0; t.lanes = 0;
      return t;
    }
    TVM_CHECK_TYPE_CODE(type_code_, kTVMDataType);
    return value_.v_type;
  }